

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageAllocator.cpp
# Opt level: O2

void __thiscall
Memory::SegmentBase<Memory::VirtualAllocWrapper>::~SegmentBase
          (SegmentBase<Memory::VirtualAllocWrapper> *this)

{
  uint uVar1;
  char *pcVar2;
  PageAllocatorBaseCommon *pPVar3;
  code *pcVar4;
  bool bVar5;
  undefined4 *puVar6;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  size_t numPages;
  PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
  *pPVar7;
  
  if ((this->super_SegmentBaseCommon).allocator == (PageAllocatorBaseCommon *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0x39,"(this->allocator != nullptr)","this->allocator != nullptr");
    if (!bVar5) {
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar6 = 0;
  }
  if (this->secondaryAllocator != (SecondaryAllocator *)0x0) {
    (*this->secondaryAllocator->_vptr_SecondaryAllocator[2])();
    this->secondaryAllocator = (SecondaryAllocator *)0x0;
  }
  pcVar2 = this->address;
  if (pcVar2 != (char *)0x0) {
    uVar1 = this->leadingGuardPageCount;
    pPVar3 = (this->super_SegmentBaseCommon).allocator;
    pPVar7 = (PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
              *)&pPVar3[-1].allocatorType;
    if (pPVar3 == (PageAllocatorBaseCommon *)0x0) {
      pPVar7 = (PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
                *)0x0;
    }
    PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
    ::GetVirtualAllocator(pPVar7);
    VirtualAllocWrapper::Free
              ((VirtualAllocWrapper *)&VirtualAllocWrapper::Instance,pcVar2 + -(ulong)(uVar1 << 0xc)
               ,this->segmentPageCount << 0xc,0x8000);
    pPVar3 = (this->super_SegmentBaseCommon).allocator;
    pPVar7 = (PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
              *)&pPVar3[-1].allocatorType;
    if (pPVar3 == (PageAllocatorBaseCommon *)0x0) {
      pPVar7 = (PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
                *)0x0;
    }
    PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
    ::ReportFree(pPVar7,this->segmentPageCount << 0xc);
    numPages = extraout_RDX;
    if ((DAT_0145c43c == '\x01') && ((this->field_0x2c & 2) != 0)) {
      RecyclerWriteBarrierManager::ToggleBarrier(this->address,this->segmentPageCount << 0xc,false);
      numPages = extraout_RDX_00;
    }
    RecyclerWriteBarrierManager::OnSegmentFree
              ((RecyclerWriteBarrierManager *)this->address,(char *)this->segmentPageCount,numPages)
    ;
  }
  return;
}

Assistant:

SegmentBase<T>::~SegmentBase()
{
    Assert(this->allocator != nullptr);

    // Cleanup secondaryAllocator before releasing pages so the destructor
    // still has access to segment memory.
    if(this->secondaryAllocator)
    {
        this->secondaryAllocator->Delete();
        this->secondaryAllocator = nullptr;
    }

    if (this->address)
    {
        char* originalAddress = this->address - (leadingGuardPageCount * AutoSystemInfo::PageSize);
        GetAllocator()->GetVirtualAllocator()->Free(originalAddress, GetPageCount() * AutoSystemInfo::PageSize, MEM_RELEASE);
        GetAllocator()->ReportFree(this->segmentPageCount * AutoSystemInfo::PageSize); //Note: We reported the guard pages free when we decommitted them during segment initialization
#if defined(TARGET_64) && defined(RECYCLER_WRITE_BARRIER_BYTE)
#if ENABLE_DEBUG_CONFIG_OPTIONS
        if (CONFIG_FLAG(StrictWriteBarrierCheck) && this->isWriteBarrierEnabled)
        {
            RecyclerWriteBarrierManager::ToggleBarrier(this->address, this->segmentPageCount * AutoSystemInfo::PageSize, false);
        }
#endif
        RecyclerWriteBarrierManager::OnSegmentFree(this->address, this->segmentPageCount);
#endif
    }
}